

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O2

void __thiscall
covenant::Solver<covenant::Sym>::Solver
          (Solver<covenant::Sym> *this,CFGProblem problem_,reg_solver_t *s,Options opts_)

{
  reg_solver_t *in_RDX;
  
  CFGProblem::CFGProblem(&this->problem,(CFGProblem *)s);
  this->solver = in_RDX;
  (this->exact).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->exact).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->exact).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->cfgs).super__Vector_base<covenant::CFG,_std::allocator<covenant::CFG>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cfgs).super__Vector_base<covenant::CFG,_std::allocator<covenant::CFG>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cfgs).super__Vector_base<covenant::CFG,_std::allocator<covenant::CFG>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->digests).
  super__Vector_base<covenant::CFGDigest<covenant::Sym>,_std::allocator<covenant::CFGDigest<covenant::Sym>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->digests).
  super__Vector_base<covenant::CFGDigest<covenant::Sym>,_std::allocator<covenant::CFGDigest<covenant::Sym>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->digests).
  super__Vector_base<covenant::CFGDigest<covenant::Sym>,_std::allocator<covenant::CFGDigest<covenant::Sym>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->reg_langs).
  super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->reg_langs).
  super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->reg_langs).
  super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->exact).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->exact).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_offset = 0;
  *(pointer *)&this->opts =
       problem_.cns.
       super__Vector_base<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)&(this->opts).abs =
       problem_.cns.
       super__Vector_base<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)&(this->opts).shortest_witness =
       problem_.cns.
       super__Vector_base<covenant::CFGProblem::Constraint,_std::allocator<covenant::CFGProblem::Constraint>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  *(undefined8 *)&(this->opts).incr_witness = problem_.var_table.table_._0_8_;
  std::ofstream::ofstream(&this->refine_log);
  std::ofstream::ofstream(&this->abstract_log);
  std::ofstream::ofstream(&this->proof_log);
  this->allCfgsReg = true;
  (this->tfac).px = (element_type *)0x0;
  (this->tfac).pn.pi_ = (sp_counted_base *)0x0;
  this->alphstart = 0;
  this->alphsz = 0;
  this->hasBeenPreprocessed = false;
  if ((this->opts).is_dot_enabled == true) {
    std::ofstream::open((char *)&this->refine_log,0x198fbc);
    std::ofstream::open((char *)&this->abstract_log,0x198fcc);
    std::ofstream::open((char *)&this->proof_log,0x198fdd);
  }
  return;
}

Assistant:

Solver(CFGProblem problem_, reg_solver_t *s, const Options opts_): 
      problem (problem_), solver (s), opts (opts_), 
      allCfgsReg (true), alphstart (0), alphsz (0),
      hasBeenPreprocessed (false)
  {  
    if (opts.is_dot_enabled)
    {
      refine_log.open("refinements.dot");
      abstract_log.open("abstractions.dot");
      proof_log.open("proof.dot");
    }
  }